

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_times.c
# Opt level: O0

void ngx_time_sigsafe_update(void)

{
  u_char (*buf) [20];
  undefined1 local_70 [8];
  timeval tv;
  ngx_time_t *tp;
  time_t sec;
  ngx_tm_t tm;
  u_char *p2;
  u_char *p;
  
  if (ngx_time_lock == 0) {
    LOCK();
    ngx_time_lock = 1;
    UNLOCK();
    gettimeofday((timeval *)local_70,(__timezone_ptr_t)0x0);
    if ((undefined1  [8])cached_time[slot].sec == local_70) {
      ngx_time_lock = 0;
    }
    else {
      if (slot == 0x3f) {
        slot = 0;
      }
      else {
        slot = slot + 1;
      }
      tv.tv_usec = (__suseconds_t)(cached_time + slot);
      ((ngx_time_t *)tv.tv_usec)->sec = 0;
      ngx_gmtime((long)local_70 + cached_gmtoff * 0x3c,(ngx_tm_t *)&sec);
      buf = cached_err_log_time + slot;
      ngx_sprintf(*buf,"%4d/%02d/%02d %02d:%02d:%02d",(ulong)(uint)tm.tm_mday,
                  (ulong)(uint)tm.tm_hour,(ulong)(uint)tm.tm_min,(ulong)(uint)tm.tm_sec,sec._4_4_,
                  (undefined4)sec);
      tm.tm_zone = (char *)(cached_syslog_time + slot);
      ngx_sprintf((u_char *)tm.tm_zone,"%s %2d %02d:%02d:%02d",months[tm.tm_hour + -1],
                  (ulong)(uint)tm.tm_min,(ulong)(uint)tm.tm_sec,(ulong)sec._4_4_,(undefined4)sec);
      ngx_cached_syslog_time.data = (u_char *)tm.tm_zone;
      ngx_time_lock = 0;
      ngx_cached_err_log_time.data = *buf;
    }
  }
  return;
}

Assistant:

void
ngx_time_sigsafe_update(void)
{
    u_char          *p, *p2;
    ngx_tm_t         tm;
    time_t           sec;
    ngx_time_t      *tp;
    struct timeval   tv;

    if (!ngx_trylock(&ngx_time_lock)) {
        return;
    }

    ngx_gettimeofday(&tv);

    sec = tv.tv_sec;

    tp = &cached_time[slot];

    if (tp->sec == sec) {
        ngx_unlock(&ngx_time_lock);
        return;
    }

    if (slot == NGX_TIME_SLOTS - 1) {
        slot = 0;
    } else {
        slot++;
    }

    tp = &cached_time[slot];

    tp->sec = 0;

    ngx_gmtime(sec + cached_gmtoff * 60, &tm);

    p = &cached_err_log_time[slot][0];

    (void) ngx_sprintf(p, "%4d/%02d/%02d %02d:%02d:%02d",
                       tm.ngx_tm_year, tm.ngx_tm_mon,
                       tm.ngx_tm_mday, tm.ngx_tm_hour,
                       tm.ngx_tm_min, tm.ngx_tm_sec);

    p2 = &cached_syslog_time[slot][0];

    (void) ngx_sprintf(p2, "%s %2d %02d:%02d:%02d",
                       months[tm.ngx_tm_mon - 1], tm.ngx_tm_mday,
                       tm.ngx_tm_hour, tm.ngx_tm_min, tm.ngx_tm_sec);

    ngx_memory_barrier();

    ngx_cached_err_log_time.data = p;
    ngx_cached_syslog_time.data = p2;

    ngx_unlock(&ngx_time_lock);
}